

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O0

BigInt * __thiscall
Conversion::convert_to_num_base
          (BigInt *__return_storage_ptr__,Conversion *this,string *num_vocab_base)

{
  bool bVar1;
  longlong val;
  reference pcVar2;
  mapped_type *pmVar3;
  BigInt local_c0;
  BigInt local_90;
  BigInt local_70;
  char local_49;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  longlong base;
  string *num_vocab_base_local;
  Conversion *this_local;
  BigInt *conv;
  
  BigInt::BigInt(__return_storage_ptr__);
  val = std::__cxx11::string::size();
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_49 = *pcVar2;
    BigInt::operator*(&local_90,__return_storage_ptr__,val);
    pmVar3 = std::
             map<char,_long_long,_std::less<char>,_std::allocator<std::pair<const_char,_long_long>_>_>
             ::operator[](&this->charToIndex,&local_49);
    BigInt::BigInt(&local_c0,*pmVar3);
    BigInt::operator+(&local_70,&local_90,&local_c0);
    BigInt::operator=(__return_storage_ptr__,&local_70);
    BigInt::~BigInt(&local_70);
    BigInt::~BigInt(&local_c0);
    BigInt::~BigInt(&local_90);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt Conversion::convert_to_num_base(string num_vocab_base) {
    BigInt conv;
    long long base = indexToChar.size();

    //! to decimal space
    for (char ch : num_vocab_base)  //! start from most significant digit
        conv = conv * base + BigInt(charToIndex[ch]);

    return conv;
}